

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proc_base_func.cpp
# Opt level: O2

uint32_t ivk::cmd_if(void *el)

{
  iterator iVar1;
  uint32_t uVar2;
  allocator local_41;
  key_type local_40;
  
  if (el == (void *)0x0) {
    uVar2 = 2;
  }
  else {
    std::__cxx11::string::string((string *)&local_40,"ret",&local_41);
    iVar1 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>_>_>
            ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ivk::proc_data>_>_>
                    *)gCmdMemMap_abi_cxx11_,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    if (iVar1._M_node == (_Base_ptr)(gCmdMemMap_abi_cxx11_ + 8)) {
      uVar2 = 7;
    }
    else {
      uVar2 = 0;
      if ((iVar1._M_node[2]._M_parent)->_M_color != _S_red) {
        proc_exec(el);
      }
    }
  }
  return uVar2;
}

Assistant:

uint32_t ivk::cmd_if(void* el){
    if(!el){
        return proc_param_err;
    }

    XMLElement** ppEl = (XMLElement**)el;
    XMLElement* pEl = *ppEl;

    // 读取返回值ret
    map<string,proc_data>::iterator it = gCmdMemMap.find("ret");
    if(it==gCmdMemMap.end()){
        return proc_mem_err;
    }

    // 如果ret非0,则继续执行这个
    uint32_t ret = *(uint32_t*)it->second.data;
    if(ret){
        proc_exec(el); // 执行while中所有指令,并可能对ret值做修改
    }
    return proc_success;
}